

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_x86.h
# Opt level: O2

void aom_dc_top_predictor_32x64_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  uint uVar1;
  uint6 uVar2;
  ulong uVar3;
  undefined1 auVar4 [11];
  undefined1 auVar5 [13];
  int iVar6;
  uint8_t *puVar7;
  bool bVar8;
  undefined4 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ushort uVar12;
  ushort uVar18;
  ushort uVar20;
  ushort uVar21;
  undefined1 auVar13 [16];
  ushort uVar22;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 uVar17;
  byte bVar19;
  
  auVar13 = psadbw(*(undefined1 (*) [16])above,(undefined1  [16])0x0);
  auVar10 = psadbw((undefined1  [16])0x0,*(undefined1 (*) [16])(above + 0x10));
  auVar11._0_2_ = auVar10._0_2_ + auVar13._0_2_;
  auVar11._2_2_ = auVar10._2_2_ + auVar13._2_2_;
  auVar11._4_2_ = auVar10._4_2_ + auVar13._4_2_;
  auVar11._6_2_ = auVar10._6_2_ + auVar13._6_2_;
  auVar11._8_2_ = auVar10._8_2_ + auVar13._8_2_;
  auVar11._10_2_ = auVar10._10_2_ + auVar13._10_2_;
  auVar11._12_2_ = auVar10._12_2_ + auVar13._12_2_;
  auVar11._14_2_ = auVar10._14_2_ + auVar13._14_2_;
  uVar12 = auVar11._8_2_ + auVar11._0_2_ + 0x10;
  uVar18 = auVar11._10_2_ + auVar11._2_2_ + 0x10;
  uVar20 = auVar11._12_2_ + auVar11._4_2_ + 0x10;
  uVar21 = auVar11._14_2_ + auVar11._6_2_ + 0x10;
  auVar13._0_2_ = uVar12 >> 5;
  uVar22 = uVar21 >> 5;
  uVar1 = CONCAT22((ushort)(auVar11._8_2_ * 2 + 0x10U) >> 5,uVar22);
  auVar14._0_9_ = (unkuint9)uVar1 << 0x30;
  uVar2 = CONCAT24((ushort)(auVar11._10_2_ * 2 + 0x10U) >> 5,uVar1);
  auVar4._6_5_ = 0;
  auVar4._0_6_ = uVar2;
  auVar15._0_11_ = auVar4 << 0x30;
  uVar3 = CONCAT26((ushort)(auVar11._12_2_ * 2 + 0x10U) >> 5,uVar2);
  auVar5._8_5_ = 0;
  auVar5._0_8_ = uVar3;
  auVar16._0_13_ = auVar5 << 0x30;
  bVar19 = (byte)(uVar21 >> 8);
  auVar16._14_2_ = (undefined2)(CONCAT19(bVar19 >> 5,CONCAT18(bVar19 >> 5,uVar3)) >> 0x40);
  auVar16[0xd] = (char)uVar22;
  bVar19 = (byte)(uVar20 >> 0xd);
  auVar15._12_4_ = (undefined4)(CONCAT37(auVar16._13_3_,CONCAT16((char)uVar22,uVar2)) >> 0x30);
  auVar15[0xb] = bVar19;
  uVar17 = (undefined1)(uVar20 >> 5);
  auVar14._10_6_ = (undefined6)(CONCAT55(auVar15._11_5_,CONCAT14(bVar19,uVar1)) >> 0x20);
  auVar14[9] = uVar17;
  bVar19 = (byte)(uVar18 >> 0xd);
  auVar13._8_8_ = (undefined8)(CONCAT73(auVar14._9_7_,CONCAT12(uVar17,uVar22)) >> 0x10);
  auVar13[7] = bVar19;
  auVar13[6] = bVar19;
  uVar17 = (undefined1)(uVar18 >> 5);
  auVar13[5] = uVar17;
  auVar13[4] = uVar17;
  bVar19 = (byte)(uVar12 >> 8);
  auVar13[3] = bVar19 >> 5;
  auVar13[2] = bVar19 >> 5;
  auVar10[0] = (undefined1)auVar13._0_2_;
  auVar10._2_14_ = auVar13._2_14_;
  auVar10[1] = auVar10[0];
  auVar10 = pshuflw(auVar11,auVar10,0);
  uVar9 = auVar10._0_4_;
  puVar7 = dst + 0x10;
  iVar6 = 0x40;
  while (bVar8 = iVar6 != 0, iVar6 = iVar6 + -1, bVar8) {
    *(undefined4 *)(puVar7 + -0x10) = uVar9;
    *(undefined4 *)(puVar7 + -0xc) = uVar9;
    *(undefined4 *)(puVar7 + -8) = uVar9;
    *(undefined4 *)(puVar7 + -4) = uVar9;
    *(undefined4 *)puVar7 = uVar9;
    *(undefined4 *)(puVar7 + 4) = uVar9;
    *(undefined4 *)(puVar7 + 8) = uVar9;
    *(undefined4 *)(puVar7 + 0xc) = uVar9;
    puVar7 = puVar7 + stride;
  }
  return;
}

Assistant:

static inline __m128i dc_sum_32_sse2(const uint8_t *ref) {
  __m128i x0 = _mm_load_si128((__m128i const *)ref);
  __m128i x1 = _mm_load_si128((__m128i const *)(ref + 16));
  const __m128i zero = _mm_setzero_si128();
  x0 = _mm_sad_epu8(x0, zero);
  x1 = _mm_sad_epu8(x1, zero);
  x0 = _mm_add_epi16(x0, x1);
  const __m128i high = _mm_unpackhi_epi64(x0, x0);
  return _mm_add_epi16(x0, high);
}